

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O0

void opj_tcd_code_block_enc_deallocate(opj_tcd_precinct_t *p_precinct)

{
  uint uVar1;
  opj_tcd_cblk_enc_t *local_20;
  opj_tcd_cblk_enc_t *l_code_block;
  OPJ_UINT32 l_nb_code_blocks;
  OPJ_UINT32 cblkno;
  opj_tcd_precinct_t *p_precinct_local;
  
  local_20 = (p_precinct->cblks).enc;
  if (local_20 != (opj_tcd_cblk_enc_t *)0x0) {
    uVar1 = p_precinct->block_size;
    for (l_code_block._4_4_ = 0; l_code_block._4_4_ < uVar1 >> 6;
        l_code_block._4_4_ = l_code_block._4_4_ + 1) {
      if (local_20->data != (OPJ_BYTE *)0x0) {
        opj_free(local_20->data + -1);
        local_20->data = (OPJ_BYTE *)0x0;
      }
      if (local_20->layers != (opj_tcd_layer_t *)0x0) {
        opj_free(local_20->layers);
        local_20->layers = (opj_tcd_layer_t *)0x0;
      }
      if (local_20->passes != (opj_tcd_pass_t *)0x0) {
        opj_free(local_20->passes);
        local_20->passes = (opj_tcd_pass_t *)0x0;
      }
      local_20 = local_20 + 1;
    }
    opj_free((p_precinct->cblks).blocks);
    (p_precinct->cblks).enc = (opj_tcd_cblk_enc_t *)0x0;
  }
  return;
}

Assistant:

static void opj_tcd_code_block_enc_deallocate(opj_tcd_precinct_t * p_precinct)
{
    OPJ_UINT32 cblkno, l_nb_code_blocks;

    opj_tcd_cblk_enc_t * l_code_block = p_precinct->cblks.enc;
    if (l_code_block) {
        l_nb_code_blocks = p_precinct->block_size / (OPJ_UINT32)sizeof(
                               opj_tcd_cblk_enc_t);

        for (cblkno = 0; cblkno < l_nb_code_blocks; ++cblkno)  {
            if (l_code_block->data) {
                /* We refer to data - 1 since below we incremented it */
                /* in opj_tcd_code_block_enc_allocate_data() */
                opj_free(l_code_block->data - 1);
                l_code_block->data = 00;
            }

            if (l_code_block->layers) {
                opj_free(l_code_block->layers);
                l_code_block->layers = 00;
            }

            if (l_code_block->passes) {
                opj_free(l_code_block->passes);
                l_code_block->passes = 00;
            }
            ++l_code_block;
        }

        opj_free(p_precinct->cblks.enc);

        p_precinct->cblks.enc = 00;
    }
}